

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86regalloc.cpp
# Opt level: O3

Error asmjit::X86RAPass_translateOperands(X86RAPass *self,Operand_ *opArray,uint32_t opCount)

{
  int iVar1;
  CodeBuilder *pCVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  VirtReg *vreg;
  Error in_EAX;
  uint uVar6;
  uint *puVar7;
  byte bVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  
  if (opCount != 0) {
    pCVar2 = (self->super_RAPass).super_CBPass._cb;
    lVar10 = 0;
    lVar11 = 0;
    do {
      uVar6 = *(uint *)((long)&opArray->field_0 + lVar10);
      puVar7 = (uint *)(ulong)uVar6;
      if ((uVar6 & 7) == 2) {
        if (8 < (uVar6 & 0xf8)) {
          iVar1 = *(int *)((long)&opArray->field_0 + lVar10 + 0xc);
          uVar9 = (ulong)(iVar1 - 0x100);
          uVar5._0_4_ = pCVar2[1].super_CodeEmitter._privateData;
          uVar5._4_4_ = pCVar2[1].super_CodeEmitter._globalHints;
          if (uVar9 < uVar5) {
            if (iVar1 == -1) goto LAB_0017caf2;
            vreg = *(VirtReg **)(*(long *)&pCVar2[1].super_CodeEmitter._type + uVar9 * 8);
            if ((uVar6 >> 0x10 & 1) == 0) {
              if (vreg->_physId == 0xff) goto LAB_0017cafc;
              *(uint *)((long)&opArray->field_0 + lVar10 + 0xc) = (uint)vreg->_physId;
            }
            else if (vreg->_memCell == (RACell *)0x0) {
              RAPass::_newVarCell(&self->super_RAPass,vreg);
              uVar6 = *(uint *)((long)&opArray->field_0 + lVar10);
            }
          }
        }
        puVar7 = (uint *)(ulong)(uVar6 & 0x1f00);
        if (0x100 < (uVar6 & 0x1f00)) {
          uVar6 = *(uint *)((long)&opArray->field_0 + lVar10 + 4);
          puVar7 = (uint *)(ulong)uVar6;
          uVar9._0_4_ = pCVar2[1].super_CodeEmitter._privateData;
          uVar9._4_4_ = pCVar2[1].super_CodeEmitter._globalHints;
          if (uVar6 - 0x100 < uVar9) {
            if (uVar6 == 0xffffffff) goto LAB_0017caf7;
            puVar7 = (uint *)((long)&opArray->field_0 + lVar10 + 4);
            bVar8 = *(byte *)(*(long *)(*(long *)&pCVar2[1].super_CodeEmitter._type +
                                       (ulong)(uVar6 - 0x100) * 8) + 0x25);
            goto LAB_0017caba;
          }
        }
      }
      else if ((uVar6 & 7) == 1) {
        uVar6 = *(uint *)((long)&opArray->field_0 + lVar10 + 4);
        puVar7 = (uint *)(ulong)uVar6;
        if (0xff < uVar6) {
          if (uVar6 == 0xffffffff) {
            X86RAPass_translateOperands();
LAB_0017cae3:
            X86RAPass_translateOperands();
LAB_0017cae8:
            X86RAPass_translateOperands();
LAB_0017caed:
            X86RAPass_translateOperands();
LAB_0017caf2:
            X86RAPass_translateOperands();
LAB_0017caf7:
            X86RAPass_translateOperands();
LAB_0017cafc:
            X86RAPass_translateOperands();
          }
          uVar3._0_4_ = pCVar2[1].super_CodeEmitter._privateData;
          uVar3._4_4_ = pCVar2[1].super_CodeEmitter._globalHints;
          if (uVar3 <= uVar6 - 0x100) goto LAB_0017cae3;
          lVar4 = *(long *)(*(long *)&pCVar2[1].super_CodeEmitter._type + (ulong)(uVar6 - 0x100) * 8
                           );
          if (lVar4 == 0) goto LAB_0017cae8;
          bVar8 = *(byte *)(lVar4 + 0x25);
          if (bVar8 == 0xff) goto LAB_0017caed;
          puVar7 = &opArray[lVar11].field_0._signature + 1;
LAB_0017caba:
          *puVar7 = (uint)bVar8;
        }
      }
      in_EAX = (Error)puVar7;
      lVar11 = lVar11 + 1;
      lVar10 = lVar10 + 0x10;
    } while ((ulong)opCount << 4 != lVar10);
  }
  return in_EAX;
}

Assistant:

static Error X86RAPass_translateOperands(X86RAPass* self, Operand_* opArray, uint32_t opCount) {
  X86Compiler* cc = self->cc();

  // Translate variables into registers.
  for (uint32_t i = 0; i < opCount; i++) {
    Operand_* op = &opArray[i];
    if (op->isVirtReg()) {
      VirtReg* vreg = cc->getVirtRegById(op->getId());
      ASMJIT_ASSERT(vreg != nullptr);
      ASMJIT_ASSERT(vreg->getPhysId() != Globals::kInvalidRegId);
      op->_reg.id = vreg->getPhysId();
    }
    else if (op->isMem()) {
      X86Mem* m = static_cast<X86Mem*>(op);

      if (m->hasBaseReg() && cc->isVirtRegValid(m->getBaseId())) {
        VirtReg* vreg = cc->getVirtRegById(m->getBaseId());

        if (m->isRegHome()) {
          self->getVarCell(vreg);
        }
        else {
          ASMJIT_ASSERT(vreg->getPhysId() != Globals::kInvalidRegId);
          op->_mem.base = vreg->getPhysId();
        }
      }

      if (m->hasIndexReg() && cc->isVirtRegValid(m->getIndexId())) {
        VirtReg* vreg = cc->getVirtRegById(m->getIndexId());
        op->_mem.index = vreg->getPhysId();
      }
    }
  }

  return kErrorOk;
}